

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_decode_chunks
               (void **idat_out,size_t *idatsize_out,uint *w,uint *h,LodePNGState *state,uchar *in,
               size_t insize)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  uchar **out;
  LodePNGColorMode *color;
  uchar *data_00;
  LodePNGInfo *in_RCX;
  LodePNGInfo *in_RDX;
  size_t *in_RSI;
  uchar *in_RDI;
  LodePNGDecoderSettings *in_R8;
  uchar **in_R9;
  LodePNGInfo *unaff_retaddr;
  size_t newsize;
  size_t pos;
  uchar *data;
  uint chunkLength;
  uint critical_pos;
  uint unknown;
  uchar *chunk;
  size_t idatsize;
  uchar *idat;
  uchar IEND;
  undefined7 in_stack_ffffffffffffff78;
  byte bVar6;
  LodePNGInfo *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  uchar *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 uVar7;
  undefined4 uVar8;
  uint *in_stack_ffffffffffffffa8;
  LodePNGInfo *info;
  undefined7 in_stack_ffffffffffffffc0;
  char cVar9;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  cVar9 = '\0';
  info = (LodePNGInfo *)0x0;
  uVar8 = 0;
  uVar7 = 1;
  in_RDI[0] = '\0';
  in_RDI[1] = '\0';
  in_RDI[2] = '\0';
  in_RDI[3] = '\0';
  in_RDI[4] = '\0';
  in_RDI[5] = '\0';
  in_RDI[6] = '\0';
  in_RDI[7] = '\0';
  ((LodePNGDecompressSettings *)&in_RCX->compression_method)->ignore_adler32 = 0;
  in_RDX->compression_method = 0;
  uVar2 = lodepng_inspect(in_stack_ffffffffffffffa8,(uint *)0x1,
                          (LodePNGState *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *(uint *)&in_R8[7].max_icc_size = uVar2;
  if ((int)in_R8[7].max_icc_size == 0) {
    iVar3 = lodepng_pixel_overflow
                      ((uint)info,(uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                       (LodePNGColorMode *)CONCAT44(uVar8,uVar7),
                       (LodePNGColorMode *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (iVar3 == 0) {
      pvVar5 = lodepng_malloc(0x34e6f0);
      if (pvVar5 != (void *)0x0) {
        out = (uchar **)((long)in_R9 + 0x21);
        do {
          bVar6 = 0;
          if (cVar9 == '\0') {
            bVar6 = (int)in_R8[7].max_icc_size != 0 ^ 0xff;
          }
          if ((bVar6 & 1) == 0) goto LAB_0034f092;
          color = (LodePNGColorMode *)((long)out - (long)in_R9);
          if ((out < in_R9) || (newsize < (undefined1 *)((long)&color->palette + 4U))) {
            if (in_R8->ignore_end == 0) {
              *(undefined4 *)&in_R8[7].max_icc_size = 0x1e;
            }
            goto LAB_0034f092;
          }
          uVar2 = lodepng_chunk_length((uchar *)0x34e7b8);
          if (0x7fffffff < uVar2) {
            if (in_R8->ignore_end == 0) {
              *(undefined4 *)&in_R8[7].max_icc_size = 0x3f;
            }
            goto LAB_0034f092;
          }
          if ((newsize < (long)&color->palette + (ulong)uVar2 + 4) ||
             ((LodePNGColorMode *)((long)&color->palette + (ulong)uVar2 + 4) < color)) {
            *(undefined4 *)&in_R8[7].max_icc_size = 0x40;
            goto LAB_0034f092;
          }
          data_00 = lodepng_chunk_data_const((uchar *)out);
          iVar3 = 0;
          uVar1 = lodepng_chunk_type_equals((uchar *)color,(char *)in_stack_ffffffffffffff80);
          if (uVar1 == '\0') {
            uVar1 = lodepng_chunk_type_equals((uchar *)color,(char *)in_stack_ffffffffffffff80);
            if (uVar1 == '\0') {
              uVar1 = lodepng_chunk_type_equals((uchar *)color,(char *)in_stack_ffffffffffffff80);
              if (uVar1 == '\0') {
                uVar1 = lodepng_chunk_type_equals((uchar *)color,(char *)in_stack_ffffffffffffff80);
                if (uVar1 == '\0') {
                  uVar1 = lodepng_chunk_type_equals
                                    ((uchar *)color,(char *)in_stack_ffffffffffffff80);
                  if (uVar1 == '\0') {
                    uVar1 = lodepng_chunk_type_equals
                                      ((uchar *)color,(char *)in_stack_ffffffffffffff80);
                    if (uVar1 == '\0') {
                      uVar1 = lodepng_chunk_type_equals
                                        ((uchar *)color,(char *)in_stack_ffffffffffffff80);
                      if (uVar1 == '\0') {
                        uVar1 = lodepng_chunk_type_equals
                                          ((uchar *)color,(char *)in_stack_ffffffffffffff80);
                        if (uVar1 == '\0') {
                          uVar1 = lodepng_chunk_type_equals
                                            ((uchar *)color,(char *)in_stack_ffffffffffffff80);
                          if (uVar1 == '\0') {
                            uVar1 = lodepng_chunk_type_equals
                                              ((uchar *)color,(char *)in_stack_ffffffffffffff80);
                            if (uVar1 == '\0') {
                              uVar1 = lodepng_chunk_type_equals
                                                ((uchar *)color,(char *)in_stack_ffffffffffffff80);
                              if (uVar1 == '\0') {
                                uVar1 = lodepng_chunk_type_equals
                                                  ((uchar *)color,(char *)in_stack_ffffffffffffff80)
                                ;
                                if (uVar1 == '\0') {
                                  uVar1 = lodepng_chunk_type_equals
                                                    ((uchar *)color,
                                                     (char *)in_stack_ffffffffffffff80);
                                  if (uVar1 == '\0') {
                                    uVar1 = lodepng_chunk_type_equals
                                                      ((uchar *)color,
                                                       (char *)in_stack_ffffffffffffff80);
                                    if (uVar1 == '\0') {
                                      uVar1 = lodepng_chunk_type_equals
                                                        ((uchar *)color,
                                                         (char *)in_stack_ffffffffffffff80);
                                      if (uVar1 == '\0') {
                                        uVar1 = lodepng_chunk_type_equals
                                                          ((uchar *)color,
                                                           (char *)in_stack_ffffffffffffff80);
                                        if (uVar1 == '\0') {
                                          uVar1 = lodepng_chunk_type_equals
                                                            ((uchar *)color,
                                                             (char *)in_stack_ffffffffffffff80);
                                          if (uVar1 == '\0') {
                                            uVar1 = lodepng_chunk_type_equals
                                                              ((uchar *)color,
                                                               (char *)in_stack_ffffffffffffff80);
                                            if (uVar1 == '\0') {
                                              uVar1 = lodepng_chunk_type_equals
                                                                ((uchar *)color,
                                                                 (char *)in_stack_ffffffffffffff80);
                                              if (uVar1 == '\0') {
                                                uVar1 = lodepng_chunk_type_name_valid((uchar *)out);
                                                if (uVar1 == '\0') {
                                                  *(undefined4 *)&in_R8[7].max_icc_size = 0x79;
                                                  goto LAB_0034f092;
                                                }
                                                uVar1 = lodepng_chunk_reserved((uchar *)out);
                                                if (uVar1 != '\0') {
                                                  *(undefined4 *)&in_R8[7].max_icc_size = 0x7a;
                                                  goto LAB_0034f092;
                                                }
                                                if ((in_R8->ignore_critical == 0) &&
                                                   (uVar1 = lodepng_chunk_ancillary((uchar *)out),
                                                   uVar1 == '\0')) {
                                                  *(undefined4 *)&in_R8[7].max_icc_size = 0x45;
                                                  goto LAB_0034f092;
                                                }
                                                iVar3 = 1;
                                                if (in_R8->remember_unknown_chunks == 0)
                                                goto LAB_0034f036;
                                                uVar2 = lodepng_chunk_append
                                                                  (out,(size_t *)CONCAT44(1,uVar7),
                                                                   (uchar *)CONCAT44(uVar2,
                                                  in_stack_ffffffffffffff98));
                                                *(uint *)&in_R8[7].max_icc_size = uVar2;
                                                iVar4 = (int)in_R8[7].max_icc_size;
                                              }
                                              else {
                                                uVar2 = readChunk_sBIT((LodePNGInfo *)
                                                                       &in_R8[2].ignore_end,data_00,
                                                                       (ulong)uVar2);
                                                *(uint *)&in_R8[7].max_icc_size = uVar2;
                                                iVar4 = (int)in_R8[7].max_icc_size;
                                              }
                                            }
                                            else {
                                              uVar2 = readChunk_eXIf(in_stack_ffffffffffffff80,
                                                                     (uchar *)CONCAT17(bVar6,
                                                  in_stack_ffffffffffffff78),0x34ee9f);
                                              *(uint *)&in_R8[7].max_icc_size = uVar2;
                                              iVar4 = (int)in_R8[7].max_icc_size;
                                            }
                                          }
                                          else {
                                            uVar2 = readChunk_cLLi((LodePNGInfo *)
                                                                   &in_R8[2].ignore_end,data_00,
                                                                   (ulong)uVar2);
                                            *(uint *)&in_R8[7].max_icc_size = uVar2;
                                            iVar4 = (int)in_R8[7].max_icc_size;
                                          }
                                        }
                                        else {
                                          uVar2 = readChunk_mDCv((LodePNGInfo *)&in_R8[2].ignore_end
                                                                 ,data_00,(ulong)uVar2);
                                          *(uint *)&in_R8[7].max_icc_size = uVar2;
                                          iVar4 = (int)in_R8[7].max_icc_size;
                                        }
                                      }
                                      else {
                                        uVar2 = readChunk_cICP((LodePNGInfo *)&in_R8[2].ignore_end,
                                                               data_00,(ulong)uVar2);
                                        *(uint *)&in_R8[7].max_icc_size = uVar2;
                                        iVar4 = (int)in_R8[7].max_icc_size;
                                      }
                                    }
                                    else {
                                      uVar2 = readChunk_iCCP(in_RCX,in_R8,(uchar *)in_R9,
                                                             CONCAT17(cVar9,
                                                  in_stack_ffffffffffffffc0));
                                      *(uint *)&in_R8[7].max_icc_size = uVar2;
                                      iVar4 = (int)in_R8[7].max_icc_size;
                                    }
                                  }
                                  else {
                                    uVar2 = readChunk_sRGB((LodePNGInfo *)&in_R8[2].ignore_end,
                                                           data_00,(ulong)uVar2);
                                    *(uint *)&in_R8[7].max_icc_size = uVar2;
                                    iVar4 = (int)in_R8[7].max_icc_size;
                                  }
                                }
                                else {
                                  uVar2 = readChunk_cHRM((LodePNGInfo *)&in_R8[2].ignore_end,data_00
                                                         ,(ulong)uVar2);
                                  *(uint *)&in_R8[7].max_icc_size = uVar2;
                                  iVar4 = (int)in_R8[7].max_icc_size;
                                }
                              }
                              else {
                                uVar2 = readChunk_gAMA((LodePNGInfo *)&in_R8[2].ignore_end,data_00,
                                                       (ulong)uVar2);
                                *(uint *)&in_R8[7].max_icc_size = uVar2;
                                iVar4 = (int)in_R8[7].max_icc_size;
                              }
                              if (iVar4 == 0) goto LAB_0034f036;
                              goto LAB_0034f092;
                            }
                            uVar2 = readChunk_pHYs((LodePNGInfo *)&in_R8[2].ignore_end,data_00,
                                                   (ulong)uVar2);
                            *(uint *)&in_R8[7].max_icc_size = uVar2;
                            iVar4 = (int)in_R8[7].max_icc_size;
                          }
                          else {
                            uVar2 = readChunk_tIME((LodePNGInfo *)&in_R8[2].ignore_end,data_00,
                                                   (ulong)uVar2);
                            *(uint *)&in_R8[7].max_icc_size = uVar2;
                            iVar4 = (int)in_R8[7].max_icc_size;
                          }
                        }
                        else {
                          if (in_R8->read_text_chunks == 0) goto LAB_0034f036;
                          uVar2 = readChunk_iTXt(unaff_retaddr,
                                                 (LodePNGDecoderSettings *)
                                                 CONCAT44(in_stack_fffffffffffffffc,
                                                          in_stack_fffffffffffffff8),in_RDI,
                                                 (size_t)in_RSI);
                          *(uint *)&in_R8[7].max_icc_size = uVar2;
                          iVar4 = (int)in_R8[7].max_icc_size;
                        }
                      }
                      else {
                        if (in_R8->read_text_chunks == 0) goto LAB_0034f036;
                        uVar2 = readChunk_zTXt(in_RDX,(LodePNGDecoderSettings *)in_RCX,
                                               (uchar *)in_R8,(size_t)in_R9);
                        *(uint *)&in_R8[7].max_icc_size = uVar2;
                        iVar4 = (int)in_R8[7].max_icc_size;
                      }
                    }
                    else {
                      if (in_R8->read_text_chunks == 0) goto LAB_0034f036;
                      uVar2 = readChunk_tEXt(info,(uchar *)out,CONCAT44(iVar3,uVar7));
                      *(uint *)&in_R8[7].max_icc_size = uVar2;
                      iVar4 = (int)in_R8[7].max_icc_size;
                    }
                  }
                  else {
                    uVar2 = readChunk_bKGD((LodePNGInfo *)&in_R8[2].ignore_end,data_00,(ulong)uVar2)
                    ;
                    *(uint *)&in_R8[7].max_icc_size = uVar2;
                    iVar4 = (int)in_R8[7].max_icc_size;
                  }
                }
                else {
                  uVar2 = readChunk_tRNS((LodePNGColorMode *)&in_R8[2].max_text_size,data_00,
                                         (ulong)uVar2);
                  *(uint *)&in_R8[7].max_icc_size = uVar2;
                  iVar4 = (int)in_R8[7].max_icc_size;
                }
                if (iVar4 != 0) goto LAB_0034f092;
              }
              else {
                uVar2 = readChunk_PLTE(color,(uchar *)in_stack_ffffffffffffff80,
                                       CONCAT17(bVar6,in_stack_ffffffffffffff78));
                *(uint *)&in_R8[7].max_icc_size = uVar2;
                if ((int)in_R8[7].max_icc_size != 0) goto LAB_0034f092;
                uVar7 = 2;
              }
            }
            else {
              cVar9 = '\x01';
            }
          }
          else {
            iVar4 = lodepng_addofl((size_t)info,(ulong)uVar2,(size_t *)&stack0xffffffffffffff80);
            if (iVar4 != 0) {
              *(undefined4 *)&in_R8[7].max_icc_size = 0x5f;
              goto LAB_0034f092;
            }
            if (newsize < in_stack_ffffffffffffff80) {
              *(undefined4 *)&in_R8[7].max_icc_size = 0x5f;
              goto LAB_0034f092;
            }
            lodepng_memcpy((void *)((long)pvVar5 + (long)info),data_00,(ulong)uVar2);
            info = (LodePNGInfo *)((long)&info->compression_method + (ulong)uVar2);
            *(void **)in_RDI = pvVar5;
            *in_RSI = (size_t)info;
            uVar7 = 3;
          }
LAB_0034f036:
          if (((in_R8->ignore_crc == 0) && (iVar3 == 0)) &&
             (uVar2 = lodepng_chunk_check_crc((uchar *)color), uVar2 != 0)) {
            *(undefined4 *)&in_R8[7].max_icc_size = 0x39;
LAB_0034f092:
            if ((int)in_R8[7].max_icc_size != 0) {
              lodepng_free((void *)0x34f0aa);
            }
            return (uint)in_R8[7].max_icc_size;
          }
          if (cVar9 == '\0') {
            out = (uchar **)
                  lodepng_chunk_next_const((uchar *)color,(uchar *)in_stack_ffffffffffffff80);
          }
        } while( true );
      }
      *(undefined4 *)&in_R8[7].max_icc_size = 0x53;
      uVar2 = 0x53;
    }
    else {
      *(undefined4 *)&in_R8[7].max_icc_size = 0x5c;
      uVar2 = 0x5c;
    }
  }
  else {
    uVar2 = (uint)in_R8[7].max_icc_size;
  }
  return uVar2;
}

Assistant:

unsigned lodepng_decode_chunks(void** idat_out, size_t* idatsize_out, unsigned* w, unsigned* h,
                               LodePNGState* state,
                               const unsigned char* in, size_t insize) {
  unsigned char IEND = 0;
  unsigned char* idat;
  size_t idatsize = 0;
  const unsigned char* chunk; /*points to beginning of next chunk*/

  /*for unknown chunk order*/
  unsigned unknown = 0;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  unsigned critical_pos = 1; /*1 = after IHDR, 2 = after PLTE, 3 = after IDAT*/
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/


  /* safe output values in case error happens */
  *idat_out = 0;
  *w = *h = 0;

  state->error = lodepng_inspect(w, h, state, in, insize); /*reads header and resets other parameters in state->info_png*/
  if(state->error) return state->error;

  if(lodepng_pixel_overflow(*w, *h, &state->info_png.color, &state->info_raw)) {
      CERROR_RETURN_ERROR(state->error, 92); /*overflow possible due to amount of pixels*/
  }

  /*the input filesize is a safe upper bound for the sum of idat chunks size*/
  idat = (unsigned char*)lodepng_malloc(insize);
  if(!idat) CERROR_RETURN_ERROR(state->error, 83); /*alloc fail*/

  chunk = &in[33]; /*first byte of the first chunk after the header*/

  /*loop through the chunks, ignoring unknown chunks and stopping at IEND chunk.
  IDAT data is put at the start of the in buffer*/
  while(!IEND && !state->error) {
    unsigned chunkLength;
    const unsigned char* data; /*the data in the chunk*/
    size_t pos = (size_t)(chunk - in);

    /*error: next chunk out of bounds of the in buffer*/
    if(chunk < in || pos + 12 > insize) {
      if(state->decoder.ignore_end) break; /*other errors may still happen though*/
      CERROR_BREAK(state->error, 30);
    }

    /*length of the data of the chunk, excluding the 12 bytes for length, chunk type and CRC*/
    chunkLength = lodepng_chunk_length(chunk);
    /*error: chunk length larger than the max PNG chunk size*/
    if(chunkLength > 2147483647) {
      if(state->decoder.ignore_end) break; /*other errors may still happen though*/
      CERROR_BREAK(state->error, 63);
    }

    if(pos + (size_t)chunkLength + 12 > insize || pos + (size_t)chunkLength + 12 < pos) {
      CERROR_BREAK(state->error, 64); /*error: size of the in buffer too small to contain next chunk (or int overflow)*/
    }

    data = lodepng_chunk_data_const(chunk);

    unknown = 0;

    /*IDAT chunk, containing compressed image data*/
    if(lodepng_chunk_type_equals(chunk, "IDAT")) {
      size_t newsize;
      if(lodepng_addofl(idatsize, chunkLength, &newsize)) CERROR_BREAK(state->error, 95);
      if(newsize > insize) CERROR_BREAK(state->error, 95);
      lodepng_memcpy(idat + idatsize, data, chunkLength);
      idatsize += chunkLength;
      *idat_out = idat;
      *idatsize_out = idatsize;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      critical_pos = 3;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    } else if(lodepng_chunk_type_equals(chunk, "IEND")) {
      /*IEND chunk*/
      IEND = 1;
    } else if(lodepng_chunk_type_equals(chunk, "PLTE")) {
      /*palette chunk (PLTE)*/
      state->error = readChunk_PLTE(&state->info_png.color, data, chunkLength);
      if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      critical_pos = 2;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    } else if(lodepng_chunk_type_equals(chunk, "tRNS")) {
      /*palette transparency chunk (tRNS). Even though this one is an ancillary chunk , it is still compiled
      in without 'LODEPNG_COMPILE_ANCILLARY_CHUNKS' because it contains essential color information that
      affects the alpha channel of pixels. */
      state->error = readChunk_tRNS(&state->info_png.color, data, chunkLength);
      if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      /*background color chunk (bKGD)*/
    } else if(lodepng_chunk_type_equals(chunk, "bKGD")) {
      state->error = readChunk_bKGD(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "tEXt")) {
      /*text chunk (tEXt)*/
      if(state->decoder.read_text_chunks) {
        state->error = readChunk_tEXt(&state->info_png, data, chunkLength);
        if(state->error) break;
      }
    } else if(lodepng_chunk_type_equals(chunk, "zTXt")) {
      /*compressed text chunk (zTXt)*/
      if(state->decoder.read_text_chunks) {
        state->error = readChunk_zTXt(&state->info_png, &state->decoder, data, chunkLength);
        if(state->error) break;
      }
    } else if(lodepng_chunk_type_equals(chunk, "iTXt")) {
      /*international text chunk (iTXt)*/
      if(state->decoder.read_text_chunks) {
        state->error = readChunk_iTXt(&state->info_png, &state->decoder, data, chunkLength);
        if(state->error) break;
      }
    } else if(lodepng_chunk_type_equals(chunk, "tIME")) {
      state->error = readChunk_tIME(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "pHYs")) {
      state->error = readChunk_pHYs(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "gAMA")) {
      state->error = readChunk_gAMA(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "cHRM")) {
      state->error = readChunk_cHRM(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "sRGB")) {
      state->error = readChunk_sRGB(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "iCCP")) {
      state->error = readChunk_iCCP(&state->info_png, &state->decoder, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "cICP")) {
      state->error = readChunk_cICP(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "mDCv")) {
      state->error = readChunk_mDCv(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "cLLi")) {
      state->error = readChunk_cLLi(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "eXIf")) {
      state->error = readChunk_eXIf(&state->info_png, data, chunkLength);
      if(state->error) break;
    } else if(lodepng_chunk_type_equals(chunk, "sBIT")) {
      state->error = readChunk_sBIT(&state->info_png, data, chunkLength);
      if(state->error) break;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    } else /*it's not an implemented chunk type, so ignore it: skip over the data*/ {
      if(!lodepng_chunk_type_name_valid(chunk)) {
        CERROR_BREAK(state->error, 121); /* invalid chunk type name */
      }
      if(lodepng_chunk_reserved(chunk)) {
        CERROR_BREAK(state->error, 122); /* invalid third lowercase character */
      }

      /*error: unknown critical chunk (5th bit of first byte of chunk type is 0)*/
      if(!state->decoder.ignore_critical && !lodepng_chunk_ancillary(chunk)) {
        CERROR_BREAK(state->error, 69);
      }

      unknown = 1;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      if(state->decoder.remember_unknown_chunks) {
        state->error = lodepng_chunk_append(&state->info_png.unknown_chunks_data[critical_pos - 1],
                                            &state->info_png.unknown_chunks_size[critical_pos - 1], chunk);
        if(state->error) break;
      }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    }

    if(!state->decoder.ignore_crc && !unknown) /*check CRC if wanted, only on known chunk types*/ {
      if(lodepng_chunk_check_crc(chunk)) CERROR_BREAK(state->error, 57); /*invalid CRC*/
    }

    if(!IEND) chunk = lodepng_chunk_next_const(chunk, in + insize);
  }

  if (state->error) lodepng_free(idat);
  return state->error;
}